

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int MRIStepGetNonlinearSystemData
              (void *arkode_mem,realtype *tcur,N_Vector *zpred,N_Vector *z,N_Vector *F,
              realtype *gamma,N_Vector *sdata,void **user_data)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(ARKodeMRIStepMem *)0xee7157);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(local_40 + 0x198);
    *in_RDX = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x78);
    *in_RCX = *(undefined8 *)(local_40 + 0x108);
    *in_R8 = *(undefined8 *)
              (*(long *)((long)in_stack_ffffffffffffffb8 + 0x30) +
              (long)*(int *)(*(long *)((long)in_stack_ffffffffffffffb8 + 0x50) +
                            (long)*(int *)((long)in_stack_ffffffffffffffb8 + 0x88) * 4) * 8);
    *in_R9 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0xa8);
    *in_stack_00000008 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x70);
    step_mem->fse = *(ARKRhsFn *)(local_40 + 0x10);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepGetNonlinearSystemData(void *arkode_mem, realtype *tcur,
                                  N_Vector *zpred, N_Vector *z,
                                  N_Vector *F, realtype *gamma,
                                  N_Vector *sdata, void **user_data)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepGetNonlinearSystemData",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  *tcur      = ark_mem->tcur;
  *zpred     = step_mem->zpred;
  *z         = ark_mem->ycur;
  *F         = step_mem->Fsi[step_mem->stage_map[step_mem->istage]];
  *gamma     = step_mem->gamma;
  *sdata     = step_mem->sdata;
  *user_data = ark_mem->user_data;

  return(ARK_SUCCESS);
}